

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

void __thiscall
jsonnet::internal::anon_unknown_0::Stack::newCall
          (Stack *this,LocationRange *loc,HeapEntity *context,HeapObject *self,uint offset,
          BindingFrame *up_values)

{
  pointer *ppFVar1;
  int iVar2;
  Frame *__last;
  pointer __first;
  ulong uVar3;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
  *this_00;
  pointer pFVar4;
  pointer pFVar5;
  _Rb_tree_node_base *p_Var6;
  ostream *poVar7;
  RuntimeError *__return_storage_ptr__;
  pointer pFVar8;
  char *__s;
  char *extraout_RDX;
  LocationRange *__n;
  ulong uVar9;
  string local_70;
  pointer local_50;
  LocationRange *local_48;
  HeapEntity *local_40;
  HeapObject *local_38;
  
  pFVar8 = (this->stack).
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar4 = (this->stack).
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = ((long)pFVar4 - (long)pFVar8 >> 4) * -0x70a3d70a3d70a3d7;
  __s = (char *)(uVar3 - 1);
  __n = loc;
  do {
    local_40 = context;
    local_38 = self;
    if ((int)(uint)__s < 0) goto LAB_00178ff5;
    uVar9 = (ulong)((uint)__s & 0x7fffffff);
    __n = (LocationRange *)(uVar9 * 400);
    iVar2 = *(int *)((long)&(__n->file)._M_dataplus._M_p + (long)pFVar8);
    __s = __s + -1;
  } while (iVar2 == 0xd);
  if (((iVar2 == 6) && (__n[1].file.field_2._M_local_buf[(long)pFVar8] == '\x01')) &&
     (__s = *(char **)((long)&__n[3].end.line + (long)pFVar8),
     __s == *(char **)((long)&__n[3].begin.column + (long)pFVar8))) {
    while (uVar9 < uVar3) {
      (this->stack).
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
      ._M_impl.super__Vector_impl_data._M_finish = pFVar4 + -1;
      Frame::~Frame(pFVar4 + -1);
      pFVar4 = (this->stack).
               super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      __s = extraout_RDX;
      uVar3 = ((long)pFVar4 -
               (long)(this->stack).
                     super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x70a3d70a3d70a3d7;
    }
    this->calls = this->calls - 1;
  }
LAB_00178ff5:
  if (this->limit <= this->calls) {
    __return_storage_ptr__ = (RuntimeError *)__cxa_allocate_exception(0x38);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"max stack frames exceeded.","");
    makeError(__return_storage_ptr__,this,loc,&local_70);
    __cxa_throw(__return_storage_ptr__,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  local_70._M_dataplus._M_p._0_4_ = 6;
  __last = (this->stack).
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__last == (this->stack).
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_48 = loc;
    this_00 = (_Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
               *)std::
                 vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                 ::_M_check_len(&this->stack,(size_type)__n,__s);
    __first = (this->stack).
              super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pFVar8 = (this->stack).
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_50 = pFVar8;
    pFVar4 = std::
             _Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ::_M_allocate(this_00,(size_t)__n);
    Frame::Frame((Frame *)(((long)__last - (long)__first) + (long)pFVar4),(FrameKind *)&local_70,
                 local_48);
    pFVar5 = std::
             vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ::_S_relocate(__first,__last,pFVar4,(_Tp_alloc_type *)pFVar8);
    pFVar5 = std::
             vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ::_S_relocate(__last,local_50,pFVar5 + 1,(_Tp_alloc_type *)pFVar8);
    if (__first != (pointer)0x0) {
      operator_delete(__first,(long)(this->stack).
                                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)__first);
    }
    (this->stack).
    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
    ._M_impl.super__Vector_impl_data._M_start = pFVar4;
    (this->stack).
    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
    ._M_impl.super__Vector_impl_data._M_finish = pFVar5;
    (this->stack).
    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pFVar4 + (long)this_00;
  }
  else {
    Frame::Frame(__last,(FrameKind *)&local_70,loc);
    ppFVar1 = &(this->stack).
               super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppFVar1 = *ppFVar1 + 1;
  }
  this->calls = this->calls + 1;
  (this->stack).
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1].context = local_40;
  (this->stack).
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1].self = local_38;
  pFVar8 = (this->stack).
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pFVar8[-1].offset = offset;
  std::
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  ::operator=(&pFVar8[-1].bindings,up_values);
  (this->stack).
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1].tailCall = false;
  p_Var6 = (up_values->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var6 == &(up_values->_M_t)._M_impl.super__Rb_tree_header) {
      return;
    }
    if (p_Var6[1]._M_parent == (_Base_ptr)0x0) break;
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"INTERNAL ERROR: No binding for variable ",0x28);
  encode_utf8(&local_70,*(UString **)(p_Var6 + 1));
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::endl<char,std::char_traits<char>>(poVar7);
  std::__cxx11::string::~string((string *)&local_70);
  abort();
}

Assistant:

void newCall(const LocationRange &loc, HeapEntity *context, HeapObject *self, unsigned offset,
                 const BindingFrame &up_values)
    {
        tailCallTrimStack();
        if (calls >= limit) {
            throw makeError(loc, "max stack frames exceeded.");
        }
        stack.emplace_back(FRAME_CALL, loc);
        calls++;
        top().context = context;
        top().self = self;
        top().offset = offset;
        top().bindings = up_values;
        top().tailCall = false;

#ifndef NDEBUG
        for (const auto &bind : up_values) {
            if (bind.second == nullptr) {
                std::cerr << "INTERNAL ERROR: No binding for variable "
                          << encode_utf8(bind.first->name) << std::endl;
                std::abort();
            }
        }
#endif
    }